

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionPair.h
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionPair::Set
          (ChCollisionPair *this,ChGeometry *mgeo1,ChGeometry *mgeo2,ChVector<double> *mp1,
          ChVector<double> *mp2,ChVector<float> *mnormal,float *mreaction_cache)

{
  float fVar1;
  undefined1 local_28 [16];
  double local_18;
  
  this->geo1 = mgeo1;
  this->geo2 = mgeo2;
  if (&this->p1 != mp1) {
    (this->p1).m_data[0] = mp1->m_data[0];
    (this->p1).m_data[1] = mp1->m_data[1];
    (this->p1).m_data[2] = mp1->m_data[2];
  }
  if (&this->p2 != mp2) {
    (this->p2).m_data[0] = mp2->m_data[0];
    (this->p2).m_data[1] = mp2->m_data[1];
    (this->p2).m_data[2] = mp2->m_data[2];
  }
  if (&this->normal != mnormal) {
    (this->normal).m_data[0] = mnormal->m_data[0];
    (this->normal).m_data[1] = mnormal->m_data[1];
    (this->normal).m_data[2] = mnormal->m_data[2];
  }
  this->just_intersection = false;
  this->reactions_cache = mreaction_cache;
  local_28 = vsubpd_avx(*(undefined1 (*) [16])mp2->m_data,*(undefined1 (*) [16])mp1->m_data);
  local_18 = mp2->m_data[2] - mp1->m_data[2];
  fVar1 = Vdot<float,double>(mnormal,(ChVector<double> *)local_28);
  this->norm_dist = (double)fVar1;
  return;
}

Assistant:

void Set(geometry::ChGeometry* mgeo1,
             geometry::ChGeometry* mgeo2,
             const ChVector<>& mp1,
             const ChVector<>& mp2,
             const ChVector<float>& mnormal,
             float* mreaction_cache = 0) {
        geo1 = mgeo1;
        geo2 = mgeo2;
        p1 = mp1;
        p2 = mp2;
        normal = mnormal;
        just_intersection = false;
        reactions_cache = mreaction_cache;

        norm_dist = Vdot(mnormal, mp2 - mp1);
    }